

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcSizeAfterConstraint(ImGuiWindow *window,ImVec2 new_size)

{
  float fVar1;
  ImGuiSizeCallback p_Var2;
  ImGuiContext *pIVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImGuiSizeCallbackData data;
  ImGuiSizeCallbackData local_38;
  
  pIVar3 = GImGui;
  if ((GImGui->NextWindowData).SizeConstraintCond != 0) {
    fVar1 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar8 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    fVar7 = new_size.x;
    fVar9 = new_size.y;
    if ((fVar1 < 0.0) || (fVar10 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar10 < 0.0))
    {
      fVar1 = (window->SizeFull).x;
    }
    else {
      if (fVar7 <= fVar10) {
        fVar10 = fVar7;
      }
      fVar1 = (float)(-(uint)(fVar7 < fVar1) & (uint)fVar1 | ~-(uint)(fVar7 < fVar1) & (uint)fVar10)
      ;
    }
    if ((fVar8 < 0.0) || (fVar7 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar7 < 0.0)) {
      fVar8 = (window->SizeFull).y;
    }
    else {
      if (fVar9 <= fVar7) {
        fVar7 = fVar9;
      }
      fVar8 = (float)(-(uint)(fVar9 < fVar8) & (uint)fVar8 | ~-(uint)(fVar9 < fVar8) & (uint)fVar7);
    }
    new_size.y = fVar8;
    new_size.x = fVar1;
    p_Var2 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var2 != (ImGuiSizeCallback)0x0) {
      local_38.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_38.Pos = window->Pos;
      local_38.CurrentSize = window->SizeFull;
      local_38.DesiredSize = new_size;
      (*p_Var2)(&local_38);
      new_size = local_38.DesiredSize;
    }
  }
  uVar6 = window->Flags;
  if ((uVar6 & 0x1000040) == 0) {
    fVar1 = (pIVar3->Style).WindowMinSize.x;
    fVar8 = (pIVar3->Style).WindowMinSize.y;
    fVar7 = new_size.x;
    uVar4 = -(uint)(fVar1 <= fVar7);
    uVar5 = -(uint)(fVar8 <= new_size.y);
    fVar9 = (float)(~uVar5 & (uint)fVar8 | (uint)new_size.y & uVar5);
    fVar10 = 0.0;
    fVar8 = 0.0;
    if ((uVar6 & 1) == 0) {
      fVar8 = (GImGui->Style).FramePadding.y;
      fVar8 = fVar8 + fVar8 + GImGui->FontBaseSize * window->FontWindowScale;
    }
    if ((uVar6 >> 10 & 1) != 0) {
      fVar10 = (GImGui->Style).FramePadding.y;
      fVar10 = fVar10 + fVar10 +
               GImGui->FontBaseSize * window->FontWindowScale + (window->DC).MenuBarOffset.y;
    }
    fVar11 = (pIVar3->Style).WindowRounding + -1.0;
    fVar8 = (float)(~-(uint)(fVar11 <= 0.0) & (uint)fVar11) + fVar8 + fVar10;
    uVar6 = -(uint)(fVar8 <= fVar9);
    new_size.y = (float)(uVar6 & (uint)fVar9 | ~uVar6 & (uint)fVar8);
    new_size.x = (float)(~uVar4 & (uint)fVar1 | uVar4 & (uint)fVar7);
  }
  return new_size;
}

Assistant:

static ImVec2 CalcSizeAfterConstraint(ImGuiWindow* window, ImVec2 new_size)
{
    ImGuiContext& g = *GImGui;
    if (g.NextWindowData.SizeConstraintCond != 0)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, window->TitleBarHeight() + window->MenuBarHeight() + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}